

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

void __thiscall OpenMD::EAM::addType(EAM *this,AtomType *atomType)

{
  _Vector_base<double,_std::allocator<double>_> *p_Var1;
  undefined8 uVar2;
  bool bVar3;
  EAMType EVar4;
  int iVar5;
  _Base_ptr p_Var6;
  long lVar7;
  int i_1;
  EAM *pEVar8;
  long lVar9;
  int i;
  RealType RVar10;
  double dVar11;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar12;
  pair<double,_double> pVar13;
  EAMAdapter ea;
  RealType rho;
  RealType r;
  vector<double,_std::allocator<double>_> funcvals_1;
  vector<double,_std::allocator<double>_> cvvals;
  vector<double,_std::allocator<double>_> rhovals;
  vector<double,_std::allocator<double>_> funcvals;
  FluctuatingChargeAdapter fqa;
  int atid;
  vector<double,_std::allocator<double>_> F;
  RealType phiCC;
  vector<double,_std::allocator<double>_> Fn;
  vector<double,_std::allocator<double>_> ccvals;
  RealType phiCV;
  EAMAtomData eamAtomData;
  RealType phiCV_1;
  EAMAdapter local_370;
  _Rb_tree_node_base *local_368;
  RealType local_360;
  _Rb_tree_node_base *local_358;
  _Base_ptr local_350;
  RealType local_348;
  EAM *local_340;
  __shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> local_338;
  _Vector_base<double,_std::allocator<double>_> local_328;
  double local_310;
  _Vector_base<double,_std::allocator<double>_> local_308;
  RealType local_2f0;
  undefined1 local_2e8 [8];
  _func_int **pp_Stack_2e0;
  pointer local_2d8;
  _Vector_base<double,_std::allocator<double>_> local_2c8;
  _Vector_base<double,_std::allocator<double>_> local_2a8;
  _Vector_base<double,_std::allocator<double>_> local_288;
  pointer local_268;
  RealType local_260;
  ForceField *local_258;
  Electrostatic *local_250;
  RealType local_248;
  double local_240;
  undefined1 local_238 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_230;
  _Base_ptr local_228;
  AtomType *local_218;
  _Rb_tree_node_base *local_210;
  undefined1 local_208 [64];
  _Vector_base<double,_std::allocator<double>_> local_1c8;
  ForceField *local_1a8;
  Electrostatic *local_1a0;
  EAMAtomData local_198;
  undefined8 local_120;
  RealType local_118;
  RealType local_110;
  undefined1 local_108 [48];
  _Vector_base<double,_std::allocator<double>_> local_d8;
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  local_198.phiCV.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (CubicSpline *)0x0;
  local_198.phiCV.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_198.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (CubicSpline *)0x0;
  local_198.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_198.Z.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_198.Z.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_198.F.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (CubicSpline *)0x0;
  local_198.F.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_198.rho.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (CubicSpline *)0x0;
  local_198.rho.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_370.at_ = atomType;
  local_218 = atomType;
  EVar4 = EAMAdapter::getEAMType(&local_370);
  local_340 = this;
  switch((ulong)EVar4) {
  case 0:
    EAMAdapter::getRhoSpline((EAMAdapter *)local_208);
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_198,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_208);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
    EAMAdapter::getFSpline((EAMAdapter *)local_208);
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_198.F.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_208);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
    EAMAdapter::getZSpline((EAMAdapter *)local_208);
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_198.Z.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_208);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
    local_198.rcut = EAMAdapter::getRcut(&local_370);
    break;
  case 1:
  case 2:
  case 3:
  case 5:
    local_368 = (_Rb_tree_node_base *)EAMAdapter::getRe(&local_370);
    local_348 = EAMAdapter::get_fe(&local_370);
    local_2f0 = EAMAdapter::getRhoe(&local_370);
    local_248 = EAMAdapter::getA(&local_370);
    local_250 = (Electrostatic *)EAMAdapter::getB(&local_370);
    local_258 = (ForceField *)EAMAdapter::getAlpha(&local_370);
    local_360 = EAMAdapter::getBeta(&local_370);
    local_260 = EAMAdapter::getKappa(&local_370);
    local_350 = (_Base_ptr)EAMAdapter::getLambda(&local_370);
    EAMAdapter::getFn((vector<double,_std::allocator<double>_> *)local_208,&local_370);
    EAMAdapter::getF((vector<double,_std::allocator<double>_> *)local_238,&local_370);
    local_268 = (pointer)EAMAdapter::getFe(&local_370);
    local_1a8 = (ForceField *)EAMAdapter::getEta(&local_370);
    local_120 = (ulong)EVar4;
    local_118 = EAMAdapter::getF0(&local_370);
    local_198.rcut = (double)local_368 * 4.0;
    if (local_198.rcut <= 9.0) {
      local_198.rcut = 9.0;
    }
    if (12.0 <= local_198.rcut) {
      local_198.rcut = 12.0;
    }
    local_240 = local_198.rcut / 1999.0;
    local_310 = local_2f0 + local_2f0;
    RVar10 = Rho(this,0.0,(RealType)local_368,local_348,local_360,(RealType)local_350);
    pEVar8 = local_340;
    if (RVar10 <= local_310) {
      RVar10 = local_310;
    }
    if (RVar10 <= 900.0) {
      RVar10 = 900.0;
    }
    local_310 = RVar10 / 2999.0;
    local_2a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_288._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_308._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8 = (undefined1  [8])0x0;
    pp_Stack_2e0 = (_func_int **)0x0;
    local_2d8 = (pointer)0x0;
    local_2c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (iVar5 = 0; iVar5 != 2000; iVar5 = iVar5 + 1) {
      local_338._M_ptr = (element_type *)((double)iVar5 * local_240);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_2a8,
                 (value_type_conflict1 *)&local_338);
      local_328._M_impl.super__Vector_impl_data._M_start =
           (pointer)Rho(pEVar8,(RealType)local_338._M_ptr,(RealType)local_368,local_348,local_360,
                        (RealType)local_350);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)local_2e8,(double *)&local_328);
      local_210 = (_Rb_tree_node_base *)
                  PhiCoreCore(pEVar8,(RealType)local_338._M_ptr,(RealType)local_368,local_248,
                              (RealType)local_258,local_260);
      local_1a0 = (Electrostatic *)
                  PhiCoreValence(pEVar8,(RealType)local_338._M_ptr,(RealType)local_368,
                                 (RealType)local_250,local_360,(RealType)local_350);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_1c8,
                 (value_type_conflict1 *)&local_210);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_308,
                 (value_type_conflict1 *)&local_1a0);
    }
    std::make_shared<OpenMD::CubicSpline>();
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_198,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_328);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_328._M_impl.super__Vector_impl_data._M_finish);
    CubicSpline::addPoints
              (local_198.rho.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<double,_std::allocator<double>_> *)&local_2a8,
               (vector<double,_std::allocator<double>_> *)local_2e8);
    uVar2 = local_120;
    std::make_shared<OpenMD::CubicSpline>();
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_198.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_328);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_328._M_impl.super__Vector_impl_data._M_finish);
    CubicSpline::addPoints
              (local_198.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<double,_std::allocator<double>_> *)&local_2a8,
               (vector<double,_std::allocator<double>_> *)&local_1c8);
    std::make_shared<OpenMD::CubicSpline>();
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_198.phiCV.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_328);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_328._M_impl.super__Vector_impl_data._M_finish);
    CubicSpline::addPoints
              (local_198.phiCV.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<double,_std::allocator<double>_> *)&local_2a8,
               (vector<double,_std::allocator<double>_> *)&local_308);
    if ((undefined1  [8])pp_Stack_2e0 != local_2e8) {
      pp_Stack_2e0 = (_func_int **)local_2e8;
    }
    switch((int)uVar2) {
    case 1:
      p_Var1 = (_Vector_base<double,_std::allocator<double>_> *)(local_60 + 0x18);
      for (iVar5 = 0; iVar5 != 3000; iVar5 = iVar5 + 1) {
        local_358 = (_Rb_tree_node_base *)((double)iVar5 * local_310);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)local_2e8,
                   (value_type_conflict1 *)&local_358);
        local_368 = local_358;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)p_Var1,
                   (vector<double,_std::allocator<double>_> *)local_208);
        pEVar8 = (EAM *)local_60;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_60,
                   (vector<double,_std::allocator<double>_> *)local_238);
        local_328._M_impl.super__Vector_impl_data._M_start =
             (pointer)Zhou2001Functional(pEVar8,(RealType)local_368,local_2f0,
                                         (vector<double,_std::allocator<double>_> *)p_Var1,
                                         (vector<double,_std::allocator<double>_> *)local_60,
                                         (RealType)local_268,(RealType)local_1a8);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)&local_2c8,(double *)&local_328);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)local_60);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(p_Var1);
      }
      break;
    case 2:
      local_360 = EAMAdapter::getRhos(&local_370);
      local_350 = (_Base_ptr)EAMAdapter::getRhol(&local_370);
      local_348 = EAMAdapter::getRhoh(&local_370);
      p_Var1 = (_Vector_base<double,_std::allocator<double>_> *)(local_90 + 0x18);
      for (iVar5 = 0; iVar5 != 3000; iVar5 = iVar5 + 1) {
        local_358 = (_Rb_tree_node_base *)((double)iVar5 * local_310);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)local_2e8,
                   (value_type_conflict1 *)&local_358);
        local_368 = local_358;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)p_Var1,
                   (vector<double,_std::allocator<double>_> *)local_208);
        pEVar8 = (EAM *)local_90;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_90,
                   (vector<double,_std::allocator<double>_> *)local_238);
        local_328._M_impl.super__Vector_impl_data._M_start =
             (pointer)Zhou2004Functional(pEVar8,(RealType)local_368,local_2f0,local_360,
                                         (vector<double,_std::allocator<double>_> *)p_Var1,
                                         (vector<double,_std::allocator<double>_> *)local_90,
                                         (RealType)local_268,(RealType)local_1a8,(RealType)local_350
                                         ,local_348);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)&local_2c8,(double *)&local_328);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)local_90);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(p_Var1);
      }
      break;
    case 3:
      local_360 = EAMAdapter::getRhos(&local_370);
      local_350 = (_Base_ptr)EAMAdapter::getF3plus(&local_370);
      local_348 = EAMAdapter::getF3minus(&local_370);
      p_Var1 = (_Vector_base<double,_std::allocator<double>_> *)(local_c0 + 0x18);
      for (iVar5 = 0; iVar5 != 3000; iVar5 = iVar5 + 1) {
        local_358 = (_Rb_tree_node_base *)((double)iVar5 * local_310);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)local_2e8,
                   (value_type_conflict1 *)&local_358);
        local_368 = local_358;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)p_Var1,
                   (vector<double,_std::allocator<double>_> *)local_208);
        pEVar8 = (EAM *)local_c0;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_c0,
                   (vector<double,_std::allocator<double>_> *)local_238);
        local_328._M_impl.super__Vector_impl_data._M_start =
             (pointer)Zhou2005Functional(pEVar8,(RealType)local_368,local_2f0,local_360,
                                         (vector<double,_std::allocator<double>_> *)p_Var1,
                                         (vector<double,_std::allocator<double>_> *)local_c0,
                                         (RealType)local_350,local_348,(RealType)local_268,
                                         (RealType)local_1a8);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)&local_2c8,(double *)&local_328);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)local_c0);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(p_Var1);
      }
      break;
    case 5:
      for (iVar5 = 0; iVar5 != 3000; iVar5 = iVar5 + 1) {
        local_358 = (_Rb_tree_node_base *)((double)iVar5 * local_310);
        pEVar8 = (EAM *)local_2e8;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)local_2e8,
                   (value_type_conflict1 *)&local_358);
        local_328._M_impl.super__Vector_impl_data._M_start =
             (pointer)RoseFunctional(pEVar8,(RealType)local_358,local_2f0,local_118);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)&local_2c8,(double *)&local_328);
      }
    }
    std::make_shared<OpenMD::CubicSpline>();
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_198.F.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_328);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_328._M_impl.super__Vector_impl_data._M_finish);
    CubicSpline::addPoints
              (local_198.F.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<double,_std::allocator<double>_> *)local_2e8,
               (vector<double,_std::allocator<double>_> *)&local_2c8);
    this = local_340;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_2c8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_2e8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_308);
    goto LAB_00214985;
  case 4:
    local_368 = (_Rb_tree_node_base *)EAMAdapter::getRe(&local_370);
    local_360 = EAMAdapter::get_fe(&local_370);
    local_248 = EAMAdapter::getA(&local_370);
    local_250 = (Electrostatic *)EAMAdapter::getB(&local_370);
    local_258 = (ForceField *)EAMAdapter::getAlpha(&local_370);
    local_260 = EAMAdapter::getBeta(&local_370);
    local_2f0 = EAMAdapter::getKappa(&local_370);
    local_310 = EAMAdapter::getLambda(&local_370);
    local_350 = (_Base_ptr)EAMAdapter::getGamma(&local_370);
    local_348 = EAMAdapter::getNu(&local_370);
    EAMAdapter::getOrhoLimits((vector<double,_std::allocator<double>_> *)local_208,&local_370);
    EAMAdapter::getOrhoE((vector<double,_std::allocator<double>_> *)local_238,&local_370);
    EAMAdapter::getOF((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&local_2a8,&local_370);
    local_198.rcut = (double)local_368 * 4.0;
    if (local_198.rcut <= 9.0) {
      local_198.rcut = 9.0;
    }
    if (12.0 <= local_198.rcut) {
      local_198.rcut = 12.0;
    }
    local_240 = local_198.rcut / 1999.0;
    dVar11 = Rho(this,0.0,(RealType)local_368,local_360,(RealType)local_350,local_348);
    pEVar8 = local_340;
    if (dVar11 <= 800.0) {
      dVar11 = 800.0;
    }
    local_268 = (pointer)(dVar11 / 2999.0);
    local_288._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d8 = (pointer)0x0;
    local_308._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_308._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8 = (undefined1  [8])0x0;
    pp_Stack_2e0 = (_func_int **)0x0;
    local_2c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_328._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (iVar5 = 0; iVar5 != 2000; iVar5 = iVar5 + 1) {
      local_358 = (_Rb_tree_node_base *)((double)iVar5 * local_240);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_288,
                 (value_type_conflict1 *)&local_358);
      local_338._M_ptr =
           (element_type *)
           Rho(pEVar8,(RealType)local_358,(RealType)local_368,local_360,(RealType)local_350,
               local_348);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&local_2c8,(double *)&local_338);
      local_1a0 = (Electrostatic *)
                  PhiCoreCore(pEVar8,(RealType)local_358,(RealType)local_368,local_248,
                              (RealType)local_258,local_2f0);
      local_110 = PhiCoreValence(pEVar8,(RealType)local_358,(RealType)local_368,(RealType)local_250,
                                 local_260,local_310);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_308,
                 (value_type_conflict1 *)&local_1a0);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)local_2e8,&local_110);
    }
    std::make_shared<OpenMD::CubicSpline>();
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_198,
               &local_338);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_338._M_refcount);
    CubicSpline::addPoints
              (local_198.rho.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<double,_std::allocator<double>_> *)&local_288,
               (vector<double,_std::allocator<double>_> *)&local_2c8);
    std::make_shared<OpenMD::CubicSpline>();
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_198.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
               &local_338);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_338._M_refcount);
    CubicSpline::addPoints
              (local_198.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<double,_std::allocator<double>_> *)&local_288,
               (vector<double,_std::allocator<double>_> *)&local_308);
    std::make_shared<OpenMD::CubicSpline>();
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_198.phiCV.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
               &local_338);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_338._M_refcount);
    CubicSpline::addPoints
              (local_198.phiCV.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<double,_std::allocator<double>_> *)&local_288,
               (vector<double,_std::allocator<double>_> *)local_2e8);
    if (local_2c8._M_impl.super__Vector_impl_data._M_finish !=
        local_2c8._M_impl.super__Vector_impl_data._M_start) {
      local_2c8._M_impl.super__Vector_impl_data._M_finish =
           local_2c8._M_impl.super__Vector_impl_data._M_start;
    }
    p_Var1 = (_Vector_base<double,_std::allocator<double>_> *)(local_108 + 0x18);
    for (iVar5 = 0; iVar5 != 3000; iVar5 = iVar5 + 1) {
      local_210 = (_Rb_tree_node_base *)((double)iVar5 * (double)local_268);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_2c8,
                 (value_type_conflict1 *)&local_210);
      local_368 = local_210;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_d8,
                 (vector<double,_std::allocator<double>_> *)local_208);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)p_Var1,
                 (vector<double,_std::allocator<double>_> *)local_238);
      pEVar8 = (EAM *)local_108;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)local_108,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&local_2a8);
      local_338._M_ptr =
           (element_type *)
           Zhou2005OxygenFunctional
                     (pEVar8,(RealType)local_368,
                      (vector<double,_std::allocator<double>_> *)&local_d8,
                      (vector<double,_std::allocator<double>_> *)p_Var1,
                      (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)local_108);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&local_328,(double *)&local_338);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)local_108);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(p_Var1);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d8);
    }
    std::make_shared<OpenMD::CubicSpline>();
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_198.F.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
               &local_338);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_338._M_refcount);
    CubicSpline::addPoints
              (local_198.F.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<double,_std::allocator<double>_> *)&local_2c8,
               (vector<double,_std::allocator<double>_> *)&local_328);
    this = local_340;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_328);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_2c8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_2e8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_308);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1c8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_288);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&local_2a8);
    goto LAB_002149ac;
  case 6:
    local_368 = (_Rb_tree_node_base *)EAMAdapter::getRe(&local_370);
    local_240 = EAMAdapter::get_fe(&local_370);
    local_248 = EAMAdapter::getA(&local_370);
    local_250 = (Electrostatic *)EAMAdapter::getB(&local_370);
    local_258 = (ForceField *)EAMAdapter::getAlpha(&local_370);
    local_360 = EAMAdapter::getBeta(&local_370);
    local_260 = EAMAdapter::getKappa(&local_370);
    local_350 = (_Base_ptr)EAMAdapter::getLambda(&local_370);
    pEVar8 = local_340;
    local_198.rcut = (double)local_368 * 4.0;
    if (local_198.rcut <= 9.0) {
      local_198.rcut = 9.0;
    }
    if (12.0 <= local_198.rcut) {
      local_198.rcut = 12.0;
    }
    local_348 = local_198.rcut / 1999.0;
    local_208._0_8_ = (AtomType *)0x0;
    local_208._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_208._16_8_ = (pointer)0x0;
    local_238 = (undefined1  [8])0x0;
    _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228 = (_Base_ptr)0x0;
    local_2a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_288._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (iVar5 = 0; iVar5 != 2000; iVar5 = iVar5 + 1) {
      local_2e8 = (undefined1  [8])((double)iVar5 * local_348);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)local_208,
                 (value_type_conflict1 *)local_2e8);
      local_308._M_impl.super__Vector_impl_data._M_start =
           (pointer)Rho(pEVar8,(RealType)local_2e8,(RealType)local_368,local_240,local_360,
                        (RealType)local_350);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&local_1c8,(double *)&local_308);
      local_2c8._M_impl.super__Vector_impl_data._M_start =
           (pointer)PhiCoreCore(pEVar8,(RealType)local_2e8,(RealType)local_368,local_248,
                                (RealType)local_258,local_260);
      local_328._M_impl.super__Vector_impl_data._M_start =
           (pointer)PhiCoreValence(pEVar8,(RealType)local_2e8,(RealType)local_368,
                                   (RealType)local_250,local_360,(RealType)local_350);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_2a8,
                 (value_type_conflict1 *)&local_2c8);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_288,
                 (value_type_conflict1 *)&local_328);
    }
    std::make_shared<OpenMD::CubicSpline>();
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_198,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_308);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_308._M_impl.super__Vector_impl_data._M_finish);
    CubicSpline::addPoints
              (local_198.rho.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<double,_std::allocator<double>_> *)local_208,
               (vector<double,_std::allocator<double>_> *)&local_1c8);
    this = local_340;
    std::make_shared<OpenMD::CubicSpline>();
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_198.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_308);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_308._M_impl.super__Vector_impl_data._M_finish);
    CubicSpline::addPoints
              (local_198.phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<double,_std::allocator<double>_> *)local_208,
               (vector<double,_std::allocator<double>_> *)&local_2a8);
    std::make_shared<OpenMD::CubicSpline>();
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_198.phiCV.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_308);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_308._M_impl.super__Vector_impl_data._M_finish);
    CubicSpline::addPoints
              (local_198.phiCV.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(vector<double,_std::allocator<double>_> *)local_208,
               (vector<double,_std::allocator<double>_> *)&local_288);
    EAMAdapter::getFSpline((EAMAdapter *)&local_308);
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_198.F.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)&local_308);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_308._M_impl.super__Vector_impl_data._M_finish);
LAB_00214985:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1c8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_288);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_2a8);
LAB_002149ac:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_238);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_208);
    break;
  case 7:
    AtomType::getName_abi_cxx11_((string *)local_208,local_218);
    snprintf(painCave.errMsg,2000,"EAM::addType found an unknown EAM type for atomType %s\n",
             local_208._0_8_);
    std::__cxx11::string::~string((string *)local_208);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    this = local_340;
  }
  local_2a8._M_impl.super__Vector_impl_data._M_start = (pointer)local_218;
  bVar3 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)&local_2a8);
  if ((bVar3) &&
     (bVar3 = FluctuatingChargeAdapter::isMetallic((FluctuatingChargeAdapter *)&local_2a8), bVar3))
  {
    local_198.isFluctuatingCharge = true;
    local_198.nValence =
         FluctuatingChargeAdapter::getNValence((FluctuatingChargeAdapter *)&local_2a8);
    local_198.nMobile = FluctuatingChargeAdapter::getNMobile((FluctuatingChargeAdapter *)&local_2a8)
    ;
  }
  else {
    local_198.isFluctuatingCharge = false;
  }
  iVar5 = AtomType::getIdent(local_218);
  local_288._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_288._M_impl.super__Vector_impl_data._M_start._4_4_,iVar5);
  local_360 = (RealType)(this->EAMtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pVar12 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->EAMtypes,(int *)&local_288);
  if (pVar12.second == false) {
    snprintf(painCave.errMsg,2000,"EAM already had a previous entry with ident %d\n",
             (ulong)local_288._M_impl.super__Vector_impl_data._M_start & 0xffffffff);
    this = local_340;
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)local_288._M_impl.super__Vector_impl_data._M_start] = SUB84(local_360,0);
  lVar9 = (long)SUB84(local_360,0);
  EAMAtomData::operator=
            ((this->EAMdata).
             super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
             super__Vector_impl_data._M_start + lVar9,&local_198);
  local_348 = (RealType)(lVar9 * 0x18);
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar9,(long)this->nEAM_);
  local_350 = &(this->EAMtypes)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var6 = (this->EAMtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var6 != local_350) {
    iVar5 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)p_Var6[1]._M_color];
    lVar7 = (long)iVar5;
    local_368 = p_Var6;
    ForceField::getAtomType(this->forceField_,p_Var6[1]._M_color);
    local_208._32_8_ = (pointer)0x0;
    local_208._40_8_ = (pointer)0x0;
    local_208._16_8_ = (pointer)0x0;
    local_208._24_8_ = 0;
    local_208._0_8_ = (AtomType *)0x0;
    local_208._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    getPhi((EAM *)local_238,(AtomType *)this,local_218);
    std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_208,
               (__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)local_238);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_230);
    pVar13 = CubicSpline::getLimits((CubicSpline *)local_208._0_8_);
    pEVar8 = local_340;
    local_208._48_8_ = pVar13.second;
    local_208[0x38] = '\0';
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
              ((local_340->MixingMap).
               super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar7,(long)local_340->nEAM_);
    EAMInteractionData::operator=
              ((EAMInteractionData *)
               (lVar7 * 0x40 +
               *(long *)((long)&(((pEVar8->MixingMap).
                                  super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                                )._M_impl.super__Vector_impl_data + (long)local_348)),
               (EAMInteractionData *)local_208);
    if (iVar5 != local_360._0_4_) {
      EAMInteractionData::operator=
                ((EAMInteractionData *)
                 (*(long *)&(local_340->MixingMap).
                            super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar7].
                            super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                            ._M_impl.super__Vector_impl_data + lVar9 * 0x40),
                 (EAMInteractionData *)local_208);
    }
    EAMInteractionData::~EAMInteractionData((EAMInteractionData *)local_208);
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_368);
    this = local_340;
  }
  EAMAtomData::~EAMAtomData(&local_198);
  return;
}

Assistant:

void EAM::addType(AtomType* atomType) {
    EAMAdapter ea = EAMAdapter(atomType);
    EAMAtomData eamAtomData;
    EAMType et = ea.getEAMType();

    switch (et) {
    case eamFuncfl: {
      eamAtomData.rho  = ea.getRhoSpline();
      eamAtomData.F    = ea.getFSpline();
      eamAtomData.Z    = ea.getZSpline();
      eamAtomData.rcut = ea.getRcut();
      break;
    }
    case eamZhou2001:
    case eamZhou2004:
    case eamZhou2005:
    case eamZhouRose: {
      RealType re              = ea.getRe();
      RealType fe              = ea.get_fe();
      RealType rhoe            = ea.getRhoe();
      RealType A               = ea.getA();
      RealType B               = ea.getB();
      RealType alpha           = ea.getAlpha();
      RealType beta            = ea.getBeta();
      RealType kappa           = ea.getKappa();
      RealType lambda          = ea.getLambda();
      std::vector<RealType> Fn = ea.getFn();
      std::vector<RealType> F  = ea.getF();
      RealType Fe              = ea.getFe();
      RealType eta             = ea.getEta();
      RealType F0              = ea.getF0();
      // RealType latticeConstant = ea.getLatticeConstant();

      int Nr = 2000;
      // eamAtomData.rcut = latticeConstant * sqrt(10.0) / 2.0;
      // eamAtomData.rcut = re * (pow(10.0, 0.3) + lambda);
      eamAtomData.rcut = std::min(12.0, std::max(9.0, 4.0 * re));
      // eamAtomData.rcut = re + (20.0 * re / beta);
      RealType dr = eamAtomData.rcut / (RealType)(Nr - 1);
      RealType r;

      int Nrho = 3000;
      RealType rhomax =
          max(900.0, max(2.0 * rhoe, Rho(0.0, re, fe, beta, lambda)));
      RealType drho = rhomax / (RealType)(Nrho - 1);
      RealType rho;
      RealType phiCC, phiCV;

      std::vector<RealType> rvals;
      std::vector<RealType> zvals;
      std::vector<RealType> ccvals;
      std::vector<RealType> cvvals;

      std::vector<RealType> rhovals;
      std::vector<RealType> funcvals;

      for (int i = 0; i < Nr; i++) {
        r = RealType(i) * dr;
        rvals.push_back(r);
        rhovals.push_back(Rho(r, re, fe, beta, lambda));
        phiCC = PhiCoreCore(r, re, A, alpha, kappa);
        phiCV = PhiCoreValence(r, re, B, beta, lambda);
        ccvals.push_back(phiCC);
        cvvals.push_back(phiCV);
      }
      eamAtomData.rho = std::make_shared<CubicSpline>();
      eamAtomData.rho->addPoints(rvals, rhovals);
      eamAtomData.phiCC = std::make_shared<CubicSpline>();
      eamAtomData.phiCC->addPoints(rvals, ccvals);
      eamAtomData.phiCV = std::make_shared<CubicSpline>();
      eamAtomData.phiCV->addPoints(rvals, cvvals);

      rhovals.clear();
      if (et == eamZhou2001) {
        for (int i = 0; i < Nrho; i++) {
          rho = RealType(i) * drho;
          rhovals.push_back(rho);
          funcvals.push_back(Zhou2001Functional(rho, rhoe, Fn, F, Fe, eta));
        }
      } else if (et == eamZhou2004) {
        RealType rhos = ea.getRhos();
        RealType rhol = ea.getRhol();
        RealType rhoh = ea.getRhoh();
        for (int i = 0; i < Nrho; i++) {
          rho = RealType(i) * drho;
          rhovals.push_back(rho);
          funcvals.push_back(
              Zhou2004Functional(rho, rhoe, rhos, Fn, F, Fe, eta, rhol, rhoh));
        }
      } else if (et == eamZhou2005) {
        RealType rhos    = ea.getRhos();
        RealType F3plus  = ea.getF3plus();
        RealType F3minus = ea.getF3minus();
        for (int i = 0; i < Nrho; i++) {
          rho = RealType(i) * drho;
          rhovals.push_back(rho);
          funcvals.push_back(Zhou2005Functional(rho, rhoe, rhos, Fn, F, F3plus,
                                                F3minus, Fe, eta));
        }
      } else if (et == eamZhouRose) {
        for (int i = 0; i < Nrho; i++) {
          rho = RealType(i) * drho;
          rhovals.push_back(rho);
          funcvals.push_back(RoseFunctional(rho, rhoe, F0));
        }
      }

      eamAtomData.F = std::make_shared<CubicSpline>();
      eamAtomData.F->addPoints(rhovals, funcvals);
      break;
    }
    case eamOxygenFuncfl: {
      RealType re = ea.getRe();
      RealType fe = ea.get_fe();

      RealType A      = ea.getA();
      RealType B      = ea.getB();
      RealType alpha  = ea.getAlpha();
      RealType beta   = ea.getBeta();
      RealType kappa  = ea.getKappa();
      RealType lambda = ea.getLambda();

      // RealType latticeConstant = ea.getLatticeConstant();

      int Nr = 2000;
      // eamAtomData.rcut = latticeConstant * sqrt(10.0) / 2.0;
      // eamAtomData.rcut = re * (pow(10.0, 0.3) + lambda);
      eamAtomData.rcut = std::min(12.0, std::max(9.0, 4.0 * re));
      // eamAtomData.rcut = re + (20.0 * re / beta);
      RealType dr = eamAtomData.rcut / (RealType)(Nr - 1);
      RealType r;
      RealType phiCC, phiCV;

      std::vector<RealType> rvals;
      std::vector<RealType> zvals;
      std::vector<RealType> ccvals;
      std::vector<RealType> cvvals;

      std::vector<RealType> rhovals;

      for (int i = 0; i < Nr; i++) {
        r = RealType(i) * dr;
        rvals.push_back(r);
        rhovals.push_back(Rho(r, re, fe, beta, lambda));
        phiCC = PhiCoreCore(r, re, A, alpha, kappa);
        phiCV = PhiCoreValence(r, re, B, beta, lambda);
        ccvals.push_back(phiCC);
        cvvals.push_back(phiCV);
      }
      eamAtomData.rho = std::make_shared<CubicSpline>();
      eamAtomData.rho->addPoints(rvals, rhovals);
      eamAtomData.phiCC = std::make_shared<CubicSpline>();
      eamAtomData.phiCC->addPoints(rvals, ccvals);
      eamAtomData.phiCV = std::make_shared<CubicSpline>();
      eamAtomData.phiCV->addPoints(rvals, cvvals);

      eamAtomData.F = ea.getFSpline();
      break;
    }
    case eamZhou2005Oxygen: {
      RealType re                           = ea.getRe();
      RealType fe                           = ea.get_fe();
      RealType A                            = ea.getA();
      RealType B                            = ea.getB();
      RealType alpha                        = ea.getAlpha();
      RealType beta                         = ea.getBeta();
      RealType kappa                        = ea.getKappa();
      RealType lambda                       = ea.getLambda();
      RealType gamma                        = ea.getGamma();
      RealType nu                           = ea.getNu();
      std::vector<RealType> OrhoLimits      = ea.getOrhoLimits();
      std::vector<RealType> OrhoE           = ea.getOrhoE();
      std::vector<std::vector<RealType>> OF = ea.getOF();

      int Nr = 2000;
      // eamAtomData.rcut = 6.0;
      // eamAtomData.rcut = re * (pow(10.0, 3.0/10.0) + nu );

      eamAtomData.rcut = std::min(12.0, std::max(9.0, 4.0 * re));
      // eamAtomData.rcut = re + (20.0 * re / beta);
      RealType dr = eamAtomData.rcut / (RealType)(Nr - 1);
      RealType r;

      int Nrho = 3000;
      // RealType rhomax = max(800.0, ZhouRho(0.0, re, fe, gamma, nu));
      RealType rhomax = max(800.0, Rho(0.0, re, fe, gamma, nu));
      RealType drho   = rhomax / (RealType)(Nrho - 1);
      RealType rho, phiCC, phiCV;

      std::vector<RealType> rvals;
      std::vector<RealType> zvals;
      std::vector<RealType> ccvals;
      std::vector<RealType> cvvals;

      std::vector<RealType> rhovals;
      std::vector<RealType> funcvals;

      for (int i = 0; i < Nr; i++) {
        r = RealType(i) * dr;
        rvals.push_back(r);
        rhovals.push_back(Rho(r, re, fe, gamma, nu));
        phiCC = PhiCoreCore(r, re, A, alpha, kappa);
        phiCV = PhiCoreValence(r, re, B, beta, lambda);
        ccvals.push_back(phiCC);
        cvvals.push_back(phiCV);
      }
      eamAtomData.rho = std::make_shared<CubicSpline>();
      eamAtomData.rho->addPoints(rvals, rhovals);
      eamAtomData.phiCC = std::make_shared<CubicSpline>();
      eamAtomData.phiCC->addPoints(rvals, ccvals);
      eamAtomData.phiCV = std::make_shared<CubicSpline>();
      eamAtomData.phiCV->addPoints(rvals, cvvals);

      rhovals.clear();
      for (int i = 0; i < Nrho; i++) {
        rho = RealType(i) * drho;
        rhovals.push_back(rho);
        funcvals.push_back(
            Zhou2005OxygenFunctional(rho, OrhoLimits, OrhoE, OF));
      }

      eamAtomData.F = std::make_shared<CubicSpline>();
      eamAtomData.F->addPoints(rhovals, funcvals);
      break;
    }

    case eamUnknown: {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAM::addType found an unknown EAM type for atomType %s\n",
               atomType->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
      break;
    }
    }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
    if (fqa.isFluctuatingCharge()) {
      if (fqa.isMetallic()) {
        eamAtomData.isFluctuatingCharge = true;
        eamAtomData.nValence            = fqa.getNValence();
        eamAtomData.nMobile             = fqa.getNMobile();
      } else {
        eamAtomData.isFluctuatingCharge = false;
      }
    } else {
      eamAtomData.isFluctuatingCharge = false;
    }

    // add it to the map:
    int atid   = atomType->getIdent();
    int eamtid = EAMtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = EAMtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAM already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    EAMtids[atid]   = eamtid;
    EAMdata[eamtid] = eamAtomData;
    MixingMap[eamtid].resize(nEAM_);

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = EAMtypes.begin(); it != EAMtypes.end(); ++it) {
      int eamtid2      = EAMtids[(*it)];
      AtomType* atype2 = forceField_->getAtomType((*it));

      EAMInteractionData mixer;
      mixer.phi           = getPhi(atomType, atype2);
      mixer.rcut          = mixer.phi->getLimits().second;
      mixer.explicitlySet = false;

      MixingMap[eamtid2].resize(nEAM_);

      MixingMap[eamtid][eamtid2] = mixer;
      if (eamtid2 != eamtid) { MixingMap[eamtid2][eamtid] = mixer; }
    }
    return;
  }